

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall testing::internal::GTestFlagSaver::GTestFlagSaver(GTestFlagSaver *this)

{
  GTestFlagSaver *this_local;
  
  std::__cxx11::string::string((string *)&this->color_);
  std::__cxx11::string::string((string *)&this->death_test_style_);
  std::__cxx11::string::string((string *)&this->filter_);
  std::__cxx11::string::string((string *)&this->internal_run_death_test_);
  std::__cxx11::string::string((string *)&this->output_);
  std::__cxx11::string::string((string *)&this->stream_result_to_);
  this->also_run_disabled_tests_ = (bool)(FLAGS_gtest_also_run_disabled_tests & 1);
  this->break_on_failure_ = (bool)(FLAGS_gtest_break_on_failure & 1);
  this->catch_exceptions_ = (bool)(FLAGS_gtest_catch_exceptions & 1);
  std::__cxx11::string::operator=((string *)&this->color_,(string *)FLAGS_gtest_color_abi_cxx11_);
  std::__cxx11::string::operator=
            ((string *)&this->death_test_style_,(string *)FLAGS_gtest_death_test_style_abi_cxx11_);
  this->death_test_use_fork_ = (bool)(FLAGS_gtest_death_test_use_fork & 1);
  std::__cxx11::string::operator=((string *)&this->filter_,(string *)FLAGS_gtest_filter_abi_cxx11_);
  std::__cxx11::string::operator=
            ((string *)&this->internal_run_death_test_,
             (string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_);
  this->list_tests_ = (bool)(FLAGS_gtest_list_tests & 1);
  std::__cxx11::string::operator=((string *)&this->output_,(string *)FLAGS_gtest_output_abi_cxx11_);
  this->print_time_ = (bool)(FLAGS_gtest_print_time & 1);
  this->random_seed_ = FLAGS_gtest_random_seed;
  this->repeat_ = FLAGS_gtest_repeat;
  this->shuffle_ = (bool)(FLAGS_gtest_shuffle & 1);
  this->stack_trace_depth_ = FLAGS_gtest_stack_trace_depth;
  std::__cxx11::string::operator=
            ((string *)&this->stream_result_to_,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
  this->throw_on_failure_ = (bool)(FLAGS_gtest_throw_on_failure & 1);
  return;
}

Assistant:

GTestFlagSaver() {
    also_run_disabled_tests_ = GTEST_FLAG(also_run_disabled_tests);
    break_on_failure_ = GTEST_FLAG(break_on_failure);
    catch_exceptions_ = GTEST_FLAG(catch_exceptions);
    color_ = GTEST_FLAG(color);
    death_test_style_ = GTEST_FLAG(death_test_style);
    death_test_use_fork_ = GTEST_FLAG(death_test_use_fork);
    filter_ = GTEST_FLAG(filter);
    internal_run_death_test_ = GTEST_FLAG(internal_run_death_test);
    list_tests_ = GTEST_FLAG(list_tests);
    output_ = GTEST_FLAG(output);
    print_time_ = GTEST_FLAG(print_time);
    random_seed_ = GTEST_FLAG(random_seed);
    repeat_ = GTEST_FLAG(repeat);
    shuffle_ = GTEST_FLAG(shuffle);
    stack_trace_depth_ = GTEST_FLAG(stack_trace_depth);
    stream_result_to_ = GTEST_FLAG(stream_result_to);
    throw_on_failure_ = GTEST_FLAG(throw_on_failure);
  }